

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::analyze_workgroup_variables(CompilerMSL *this)

{
  anon_class_8_1_8991fb9c local_18;
  CompilerMSL *local_10;
  CompilerMSL *this_local;
  
  local_18.this = this;
  local_10 = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerMSL::analyze_workgroup_variables()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_18);
  return;
}

Assistant:

void CompilerMSL::analyze_workgroup_variables()
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		// If workgroup variables have initializer, it can only be ConstantNull (zero init)
		if (var.storage == StorageClassWorkgroup && var.initializer)
		{
			needs_workgroup_zero_init = true;

			// MSL compiler does not like the routine to initialize simple threadgroup variables,
			// falsely claiming it is "sometimes uninitialized". Suppress it.
			auto &type = get_variable_data_type(var);
			if (type.array.empty() && type.member_types.empty())
				suppress_sometimes_unitialized = true;
		}
	});
}